

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_iterator_suite.cpp
# Opt level: O0

void fail_map(void)

{
  insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *piVar1;
  basic_variable<std::allocator<char>_> *local_518;
  basic_variable<std::allocator<char>_> *local_4b8;
  error *ex_3;
  basic_variable<std::allocator<char>_> local_428;
  basic_variable<std::allocator<char>_> local_3f8;
  basic_variable<std::allocator<char>_> local_3c8;
  undefined1 local_398 [72];
  iterator local_350;
  undefined1 local_338 [8];
  insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> inserter_3;
  variable data_3;
  error *ex_2;
  basic_variable<std::allocator<char>_> local_2a8;
  undefined1 local_278 [72];
  iterator local_230;
  undefined1 local_218 [8];
  insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> inserter_2;
  variable data_2;
  error *ex_1;
  iterator local_160;
  undefined1 local_148 [8];
  insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> inserter_1;
  variable data_1;
  error *ex;
  basic_variable<std::allocator<char>_> local_b8;
  iterator local_70;
  undefined1 local_58 [8];
  insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> inserter;
  variable data;
  
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_70,
             (basic_variable<std::allocator<char>_> *)
             &inserter.iter.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::insert_iterator
            ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_58,
             (basic_variable<std::allocator<char>_> *)
             &inserter.iter.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,&local_70);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_70);
  ex._4_4_ = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_b8,(nullable *)((long)&ex + 4));
  piVar1 = std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator*
                     ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
                      local_58);
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator=
            (piVar1,&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::protocol::core::detail::throw_failed_impl
            ("*inserter = null","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/insert_iterator_suite.cpp"
             ,0x6b,"void fail_map()");
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::~insert_iterator
            ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_58);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &inserter.iter.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_160,
             (basic_variable<std::allocator<char>_> *)
             &inserter_1.iter.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::insert_iterator
            ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_148,
             (basic_variable<std::allocator<char>_> *)
             &inserter_1.iter.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,&local_160);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_160);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_1,"alpha");
  piVar1 = std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator*
                     ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
                      local_148);
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator=
            (piVar1,(value_type *)&ex_1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_1);
  trial::protocol::core::detail::throw_failed_impl
            ("*inserter = \"alpha\"","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/insert_iterator_suite.cpp"
             ,0x72,"void fail_map()");
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::~insert_iterator
            ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_148);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &inserter_1.iter.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_230,
             (basic_variable<std::allocator<char>_> *)
             &inserter_2.iter.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::insert_iterator
            ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_218,
             (basic_variable<std::allocator<char>_> *)
             &inserter_2.iter.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,&local_230);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_230);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2a8,"alpha");
  local_278._0_8_ = &local_2a8;
  local_278._8_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_278 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_278);
  piVar1 = std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator*
                     ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
                      local_218);
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator=
            (piVar1,(value_type *)(local_278 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_278 + 0x10));
  local_4b8 = (basic_variable<std::allocator<char>_> *)local_278;
  do {
    local_4b8 = local_4b8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_4b8);
  } while (local_4b8 != &local_2a8);
  trial::protocol::core::detail::throw_failed_impl
            ("(*inserter = { \"alpha\" })","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/insert_iterator_suite.cpp"
             ,0x79,"void fail_map()");
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::~insert_iterator
            ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &inserter_2.iter.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_350,
             (basic_variable<std::allocator<char>_> *)
             &inserter_3.iter.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::insert_iterator
            ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_338,
             (basic_variable<std::allocator<char>_> *)
             &inserter_3.iter.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,&local_350);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_350);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_428,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3f8,"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3c8,"charlie");
  local_398._0_8_ = &local_428;
  local_398._8_8_ = 3;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_398 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_398);
  piVar1 = std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator*
                     ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
                      local_338);
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator=
            (piVar1,(value_type *)(local_398 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_398 + 0x10));
  local_518 = (basic_variable<std::allocator<char>_> *)local_398;
  do {
    local_518 = local_518 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_518);
  } while (local_518 != &local_428);
  trial::protocol::core::detail::throw_failed_impl
            ("(*inserter = { \"alpha\", \"bravo\", \"charlie\" })","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/insert_iterator_suite.cpp"
             ,0x80,"void fail_map()");
  std::insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_>::~insert_iterator
            ((insert_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_338);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &inserter_3.iter.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  return;
}

Assistant:

void fail_map()
{
    {
        variable data = map::make();
        std::insert_iterator<variable> inserter(data, data.begin());
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(*inserter = null,
                                        error,
                                        "incompatible type");
    }
    {
        variable data = map::make();
        std::insert_iterator<variable> inserter(data, data.begin());
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(*inserter = "alpha",
                                        error,
                                        "incompatible type");
    }
    {
        variable data = map::make();
        std::insert_iterator<variable> inserter(data, data.begin());
        TRIAL_PROTOCOL_TEST_THROW_EQUAL((*inserter = { "alpha" }),
                                        error,
                                        "incompatible type");
    }
    {
        variable data = map::make();
        std::insert_iterator<variable> inserter(data, data.begin());
        TRIAL_PROTOCOL_TEST_THROW_EQUAL((*inserter = { "alpha", "bravo", "charlie" }),
                                        error,
                                        "incompatible type");
    }
}